

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

Value * __thiscall
GlobOpt::HoistConstantLoadAndPropagateValueBackward
          (GlobOpt *this,Var varConst,Instr *origInstr,Value *value)

{
  ValueNumber VVar1;
  JitArenaAllocator *alloc;
  ValueInfo *pVVar2;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  OpndKind OVar6;
  ValueType type;
  undefined4 *puVar7;
  RegOpnd *pRVar8;
  Instr *instr;
  StackSym *this_00;
  BasicBlock *pBVar9;
  Value *pVVar10;
  Type_conflict pBVar11;
  char *message;
  char *error;
  Type_conflict pBVar12;
  GlobOpt *pGVar13;
  uint lineNumber;
  char *fileName;
  ulong uVar14;
  InvariantBlockBackwardIterator local_b8;
  RegOpnd *local_58;
  long local_50;
  StackSym *local_48;
  Value *local_40;
  GlobOpt *local_38;
  
  if (this->prePassLoop != (Loop *)0x0) {
    return value;
  }
  local_40 = value;
  if ((this->currentBlock == this->func->m_fg->blockList) &&
     (bVar4 = IR::Instr::TransfersSrcValue(origInstr), bVar4)) {
    return local_40;
  }
  uVar14 = (ulong)varConst & 0xffff000000000000;
  bVar4 = ((ulong)varConst & 0x1ffff00000000) == 0x1000000000000;
  local_38 = this;
  if (bVar4 || uVar14 != 0x1000000000000) {
    if (uVar14 != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      fileName = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
      ;
      error = "(Js::TaggedInt::Is(varConst))";
      message = "Js::TaggedInt::Is(varConst)";
      lineNumber = 0x11b7;
      goto LAB_004525b2;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    fileName = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Language/TaggedInt.inl"
    ;
    error = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
    message = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
    lineNumber = 0x2a;
LAB_004525b2:
    bVar5 = Js::Throw::ReportAssert(fileName,lineNumber,error,message);
    if (!bVar5) goto LAB_004528c3;
    *puVar7 = 0;
  }
  pGVar13 = local_38;
  local_48 = StackSym::New(local_38->func);
  pRVar8 = IR::RegOpnd::New(local_48,TyVar,pGVar13->func);
  type = ValueType::GetInt(true);
  local_58 = pRVar8;
  instr = IR::Instr::NewConstantLoad(pRVar8,(intptr_t)varConst,type,pGVar13->func,(Var)0x0);
  IR::Instr::InsertAfter(pGVar13->func->m_fg->blockList->firstInstr,instr);
  if (bVar4 || uVar14 != 0x1000000000000) {
    pGVar13 = local_38;
    if (uVar14 == 0x1000000000000) goto LAB_004526ae;
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Language/TaggedInt.inl"
                       ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                       "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar4) goto LAB_004528c3;
    *puVar7 = 0;
LAB_004526ae:
    pGVar13 = local_38;
    bVar4 = IsTypeSpecPhaseOff(local_38->func);
    if (!bVar4) {
      instr->m_opcode = Ld_I4;
      pRVar8 = (RegOpnd *)instr->m_dst;
      OVar6 = IR::Opnd::GetKind((Opnd *)pRVar8);
      if (OVar6 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar4) {
LAB_004528c3:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar7 = 0;
      }
      pGVar13 = local_38;
      ToInt32Dst(local_38,instr,pRVar8,local_38->currentBlock);
      this_00 = IR::Opnd::GetStackSym(instr->m_dst);
      StackSym::SetIsConst(this_00);
      local_50 = 0x38;
      goto LAB_0045277c;
    }
  }
  BVSparse<Memory::JitArenaAllocator>::Set
            ((pGVar13->currentBlock->globOptData).liveVarSyms,(local_48->super_Sym).m_id);
  local_50 = 0x30;
LAB_0045277c:
  local_40 = GlobOptBlockData::InsertNewValue
                       (&pGVar13->currentBlock->globOptData,local_40,&local_58->super_Opnd);
  pBVar9 = pGVar13->func->m_fg->blockList;
  if (pGVar13->currentBlock != pBVar9) {
    InvariantBlockBackwardIterator::InvariantBlockBackwardIterator
              (&local_b8,pGVar13,pGVar13->currentBlock,pBVar9,(StackSym *)0x0,0,false);
    while (local_b8.block != local_b8.exclusiveEndBlock) {
      pBVar9 = InvariantBlockBackwardIterator::Block(&local_b8);
      BVSparse<Memory::JitArenaAllocator>::Set
                (*(BVSparse<Memory::JitArenaAllocator> **)
                  ((long)&(pBVar9->globOptData).symToValueMap + local_50),(local_48->super_Sym).m_id
                );
      pVVar10 = GlobOptBlockData::FindValue(&pBVar9->globOptData,&local_48->super_Sym);
      if (pVVar10 == (Value *)0x0) {
        VVar1 = local_40->valueNumber;
        alloc = local_38->alloc;
        ValueInfo::SetIsShared(local_40->valueInfo);
        pVVar2 = local_40->valueInfo;
        pVVar10 = (Value *)new<Memory::JitArenaAllocator>(0x10,alloc,0x3eba5c);
        pVVar10->valueNumber = VVar1;
        pVVar10->valueInfo = pVVar2;
        GlobOptBlockData::SetValue(&pBVar9->globOptData,pVVar10,&local_48->super_Sym);
      }
      InvariantBlockBackwardIterator::MoveNext(&local_b8);
    }
    if (local_b8.blockBV.head != (Type_conflict)0x0) {
      pBVar12 = (local_b8.blockBV.alloc)->bvFreeList;
      do {
        pBVar11 = local_b8.blockBV.head;
        local_b8.blockBV.head = pBVar11->next;
        pBVar11->next = pBVar12;
        pBVar12 = pBVar11;
      } while (local_b8.blockBV.head != (Type)0x0);
      (local_b8.blockBV.alloc)->bvFreeList = pBVar11;
    }
  }
  return local_40;
}

Assistant:

Value *
GlobOpt::HoistConstantLoadAndPropagateValueBackward(Js::Var varConst, IR::Instr * origInstr, Value * value)
{
    if (this->IsLoopPrePass() ||
        ((this->currentBlock == this->func->m_fg->blockList) &&
        origInstr->TransfersSrcValue()))
    {
        return value;
    }

    // Only hoisting taggable int const loads for now. Could be extended to other constants (floats, strings, addr opnds) if we see some benefit.
    Assert(Js::TaggedInt::Is(varConst));

    // Insert a load of the constant at the top of the function
    StackSym *    dstSym = StackSym::New(this->func);
    IR::RegOpnd * constRegOpnd = IR::RegOpnd::New(dstSym, TyVar, this->func);
    IR::Instr *   loadInstr = IR::Instr::NewConstantLoad(constRegOpnd, (intptr_t)varConst, ValueType::GetInt(true), this->func);
    this->func->m_fg->blockList->GetFirstInstr()->InsertAfter(loadInstr);

    // Type-spec the load (Support for floats needs to be added when we start hoisting float constants).
    bool typeSpecedToInt = false;
    if (Js::TaggedInt::Is(varConst) && !IsTypeSpecPhaseOff(this->func))
    {
        typeSpecedToInt = true;
        loadInstr->m_opcode = Js::OpCode::Ld_I4;
        ToInt32Dst(loadInstr, loadInstr->GetDst()->AsRegOpnd(), this->currentBlock);
        loadInstr->GetDst()->GetStackSym()->SetIsConst();
    }
    else
    {
        CurrentBlockData()->liveVarSyms->Set(dstSym->m_id);
    }

    // Add the value (object) to the current block's symToValueMap and propagate the value backward to all relevant blocks so it is available on merges.
    value = CurrentBlockData()->InsertNewValue(value, constRegOpnd);

    BVSparse<JitArenaAllocator>* GlobOptBlockData::*bv;
    bv = typeSpecedToInt ? &GlobOptBlockData::liveInt32Syms : &GlobOptBlockData::liveVarSyms; // Will need to be expanded when we start hoisting float constants.
    if (this->currentBlock != this->func->m_fg->blockList)
    {
        for (InvariantBlockBackwardIterator it(this, this->currentBlock, this->func->m_fg->blockList, nullptr);
             it.IsValid();
             it.MoveNext())
        {
            BasicBlock * block = it.Block();
            (block->globOptData.*bv)->Set(dstSym->m_id);
            if (!block->globOptData.FindValue(dstSym))
            {
                Value *const valueCopy = CopyValue(value, value->GetValueNumber());
                block->globOptData.SetValue(valueCopy, dstSym);
            }
        }
    }

    return value;
}